

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::MessageHolder::extractMessage(MessageHolder *this,int index)

{
  bool bVar1;
  pointer pMVar2;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  Message *in_RDI;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  *in_stack_ffffffffffffffc8;
  _Head_base<0UL,_helics::Message_*,_false> __x;
  
  __x._M_head_impl = in_RDI;
  bVar1 = isValidIndex<int,std::vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>>
                    ((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffc8);
  if (bVar1) {
    std::
    vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    ::operator[]((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                  *)in_RSI,(long)in_EDX);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                       0x1df542);
    if (bVar1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (in_RSI,(value_type_conflict1 *)__x._M_head_impl);
      std::
      vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ::operator[]((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                    *)in_RSI,(long)in_EDX);
      pMVar2 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                         ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                          0x1df572);
      pMVar2->backReference = (void *)0x0;
      std::
      vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ::operator[]((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                    *)in_RSI,(long)in_EDX);
      pMVar2 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                         ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                          0x1df594);
      pMVar2->messageValidation = 0;
      std::
      vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ::operator[]((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                    *)in_RSI,(long)in_EDX);
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)in_RDI,
                 (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 in_stack_ffffffffffffffc8);
      return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)__x._M_head_impl;
    }
  }
  std::unique_ptr<helics::Message,std::default_delete<helics::Message>>::
  unique_ptr<std::default_delete<helics::Message>,void>
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)in_RDI,
             in_stack_ffffffffffffffc8);
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)__x._M_head_impl;
}

Assistant:

std::unique_ptr<Message> MessageHolder::extractMessage(int index)
{
    if (isValidIndex(index, messages)) {
        if (messages[index]) {
            freeMessageSlots.push_back(index);
            messages[index]->backReference = nullptr;
            messages[index]->messageValidation = 0;
            return std::move(messages[index]);
        }
    }
    return nullptr;
}